

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_raw.cpp
# Opt level: O0

void __thiscall ut_raw::node_depth::test_method(node_depth *this)

{
  undefined8 uVar1;
  bool bVar2;
  const_bf_iterator *pcVar3;
  lazy_ostream *plVar4;
  node_type *pnVar5;
  node_type *pnVar6;
  node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  *pnVar7;
  pointer pnVar8;
  data_type *pdVar9;
  size_type sVar10;
  basic_cstring<const_char> local_4f08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4ef8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_4ed8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
  local_4eb8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
  local_4e98;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
  local_4e78;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
  local_4e58;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_4e38;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_4e18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4df8;
  assertion_result local_4dd8;
  basic_cstring<const_char> local_4dc0;
  basic_cstring<const_char> local_4db0;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_4da0;
  const_bf_iterator local_4d48;
  const_bf_iterator local_4cf0;
  const_bf_iterator local_4c98;
  stringstream local_4c40 [8];
  stringstream tst_17;
  ostream local_4c30 [376];
  basic_cstring<const_char> local_4ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4aa8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_4a88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
  local_4a68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_4a48;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
  local_4a28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
  local_4a08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_49e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_49c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_49a8;
  assertion_result local_4988;
  basic_cstring<const_char> local_4970;
  basic_cstring<const_char> local_4960;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_4950;
  const_bf_iterator local_48f8;
  const_bf_iterator local_48a0;
  const_bf_iterator local_4848;
  stringstream local_47f0 [8];
  stringstream tst_16;
  ostream local_47e0 [376];
  iterator local_4668;
  basic_cstring<const_char> local_4650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4640;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_4620;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
  local_4600;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
  local_45e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[4],_const_char_(&)[4]>
  local_45c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[4],_const_char_(&)[4]>,_char[13],_const_char_(&)[13]>
  local_45a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[4],_const_char_(&)[4]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_4580;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[4],_const_char_(&)[4]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_4560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4540;
  assertion_result local_4520;
  basic_cstring<const_char> local_4508;
  basic_cstring<const_char> local_44f8;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_44e8;
  const_bf_iterator local_4490;
  const_bf_iterator local_4438;
  const_bf_iterator local_43e0;
  stringstream local_4388 [8];
  stringstream tst_15;
  ostream local_4378 [376];
  basic_cstring<const_char> local_4200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_41f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_41d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
  local_41b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_4190;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[5],_const_char_(&)[5]>
  local_4170;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[5],_const_char_(&)[5]>,_char[13],_const_char_(&)[13]>
  local_4150;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[5],_const_char_(&)[5]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_4130;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[5],_const_char_(&)[5]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_4110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40f0;
  assertion_result local_40d0;
  basic_cstring<const_char> local_40b8;
  basic_cstring<const_char> local_40a8;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_4098;
  const_bf_iterator local_4040;
  const_bf_iterator local_3fe8;
  const_bf_iterator local_3f90;
  stringstream local_3f38 [8];
  stringstream tst_14;
  ostream local_3f28 [376];
  iterator local_3db0;
  basic_cstring<const_char> local_3d98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_3d68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
  local_3d48;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
  local_3d28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>
  local_3d08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>,_char[13],_const_char_(&)[13]>
  local_3ce8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_3cc8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_3ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c88;
  assertion_result local_3c68;
  basic_cstring<const_char> local_3c50;
  basic_cstring<const_char> local_3c40;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_3c30;
  const_bf_iterator local_3bd8;
  const_bf_iterator local_3b80;
  const_bf_iterator local_3b28;
  stringstream local_3ad0 [8];
  stringstream tst_13;
  ostream local_3ac0 [376];
  basic_cstring<const_char> local_3948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3938;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_3918;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
  local_38f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_38d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>
  local_38b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>
  local_3898;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_3878;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_3858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3838;
  assertion_result local_3818;
  basic_cstring<const_char> local_3800;
  basic_cstring<const_char> local_37f0;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_37e0;
  const_bf_iterator local_3788;
  const_bf_iterator local_3730;
  const_bf_iterator local_36d8;
  stringstream local_3680 [8];
  stringstream tst_12;
  ostream local_3670 [376];
  iterator local_34f8;
  basic_cstring<const_char> local_34e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_34d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_34b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
  local_3490;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_3470;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>
  local_3450;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>,_char[13],_const_char_(&)[13]>
  local_3430;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_3410;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_33f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_33d0;
  assertion_result local_33b0;
  basic_cstring<const_char> local_3398;
  basic_cstring<const_char> local_3388;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_3378;
  const_bf_iterator local_3320;
  const_bf_iterator local_32c8;
  const_bf_iterator local_3270;
  stringstream local_3218 [8];
  stringstream tst_11;
  ostream local_3208 [376];
  basic_cstring<const_char> local_3090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3080;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_3060;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
  local_3040;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
  local_3020;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>
  local_3000;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>,_char[13],_const_char_(&)[13]>
  local_2fe0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2fc0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_2fa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f80;
  assertion_result local_2f60;
  basic_cstring<const_char> local_2f48;
  basic_cstring<const_char> local_2f38;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_2f28;
  const_bf_iterator local_2ed0;
  const_bf_iterator local_2e78;
  const_bf_iterator local_2e20;
  stringstream local_2dc8 [8];
  stringstream tst_10;
  ostream local_2db8 [376];
  basic_cstring<const_char> local_2c40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c30;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_2c10;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
  local_2bf0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_2bd0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[20],_const_char_(&)[20]>
  local_2bb0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[20],_const_char_(&)[20]>,_char[13],_const_char_(&)[13]>
  local_2b90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[20],_const_char_(&)[20]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2b70;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[20],_const_char_(&)[20]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_2b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b30;
  assertion_result local_2b10;
  basic_cstring<const_char> local_2af8;
  basic_cstring<const_char> local_2ae8;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_2ad8;
  const_bf_iterator local_2a80;
  const_bf_iterator local_2a28;
  const_bf_iterator local_29d0;
  stringstream local_2978 [8];
  stringstream tst_9;
  ostream local_2968 [380];
  data_type local_27ec;
  iterator local_27e8;
  basic_cstring<const_char> local_27d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_27a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
  local_2780;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_2760;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>
  local_2740;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>,_char[13],_const_char_(&)[13]>
  local_2720;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2700;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_26e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26c0;
  assertion_result local_26a0;
  basic_cstring<const_char> local_2688;
  basic_cstring<const_char> local_2678;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_2668;
  const_bf_iterator local_2610;
  const_bf_iterator local_25b8;
  const_bf_iterator local_2560;
  stringstream local_2508 [8];
  stringstream tst_8;
  ostream local_24f8 [376];
  basic_cstring<const_char> local_2380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2370;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_2350;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
  local_2330;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
  local_2310;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>
  local_22f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>,_char[13],_const_char_(&)[13]>
  local_22d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_22b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_2290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2270;
  assertion_result local_2250;
  basic_cstring<const_char> local_2238;
  basic_cstring<const_char> local_2228;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_2218;
  const_bf_iterator local_21c0;
  const_bf_iterator local_2168;
  const_bf_iterator local_2110;
  stringstream local_20b8 [8];
  stringstream tst_7;
  ostream local_20a8 [376];
  basic_cstring<const_char> local_1f30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f20;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_1f00;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
  local_1ee0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_1ec0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[17],_const_char_(&)[17]>
  local_1ea0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[17],_const_char_(&)[17]>,_char[13],_const_char_(&)[13]>
  local_1e80;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[17],_const_char_(&)[17]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1e60;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[17],_const_char_(&)[17]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_1e40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e20;
  assertion_result local_1e00;
  basic_cstring<const_char> local_1de8;
  basic_cstring<const_char> local_1dd8;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_1dc8;
  const_bf_iterator local_1d70;
  const_bf_iterator local_1d18;
  const_bf_iterator local_1cc0;
  stringstream local_1c68 [8];
  stringstream tst_6;
  ostream local_1c58 [380];
  data_type local_1adc;
  iterator local_1ad8;
  data_type local_1abc;
  iterator local_1ab8;
  data_type local_1a9c;
  iterator local_1a98;
  data_type local_1a7c;
  iterator local_1a78;
  basic_cstring<const_char> local_1a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a50;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_1a30;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
  local_1a10;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_19f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
  local_19d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_19b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1990;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_1970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1950;
  assertion_result local_1930;
  basic_cstring<const_char> local_1918;
  basic_cstring<const_char> local_1908;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_18f8;
  const_bf_iterator local_18a0;
  const_bf_iterator local_1848;
  const_bf_iterator local_17f0;
  stringstream local_1798 [8];
  stringstream tst_5;
  ostream local_1788 [376];
  basic_cstring<const_char> local_1610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1600;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_15e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
  local_15c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
  local_15a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
  local_1580;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_1560;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1540;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_1520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1500;
  assertion_result local_14e0;
  basic_cstring<const_char> local_14c8;
  basic_cstring<const_char> local_14b8;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_14a8;
  const_bf_iterator local_1450;
  const_bf_iterator local_13f8;
  const_bf_iterator local_13a0;
  stringstream local_1348 [8];
  stringstream tst_4;
  ostream local_1338 [376];
  basic_cstring<const_char> local_11c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_1190;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
  local_1170;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_1150;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
  local_1130;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_1110;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_10f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_10d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b0;
  assertion_result local_1090;
  basic_cstring<const_char> local_1078;
  basic_cstring<const_char> local_1068;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_1058;
  const_bf_iterator local_1000;
  const_bf_iterator local_fa8;
  const_bf_iterator local_f50;
  stringstream local_ef8 [8];
  stringstream tst_3;
  ostream local_ee8 [380];
  data_type local_d6c;
  iterator local_d68;
  data_type local_d4c;
  iterator local_d48;
  basic_cstring<const_char> local_d30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d20;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_d00;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
  local_ce0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
  local_cc0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
  local_ca0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
  local_c80;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c60;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_c40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c20;
  assertion_result local_c00;
  basic_cstring<const_char> local_be8;
  basic_cstring<const_char> local_bd8;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_bc8;
  const_bf_iterator local_b70;
  const_bf_iterator local_b18;
  const_bf_iterator local_ac0;
  stringstream local_a68 [8];
  stringstream tst_2;
  ostream local_a58 [376];
  basic_cstring<const_char> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_8b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
  local_890;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
  local_870;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
  local_850;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
  local_830;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_810;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  assertion_result local_7b0;
  basic_cstring<const_char> local_798;
  basic_cstring<const_char> local_788;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_778;
  const_bf_iterator local_720;
  const_bf_iterator local_6c8;
  const_bf_iterator local_670;
  stringstream local_618 [8];
  stringstream tst_1;
  ostream local_608 [376];
  basic_cstring<const_char> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]> local_460;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
  local_440;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
  local_420;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
  local_400;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
  local_3e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_3c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
  local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  assertion_result local_360;
  basic_cstring<const_char> local_348;
  basic_cstring<const_char> local_338;
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_328;
  const_bf_iterator local_2d0;
  const_bf_iterator local_278;
  const_bf_iterator local_220;
  stringstream local_1c8 [8];
  stringstream tst;
  ostream local_1b8 [396];
  data_type local_2c;
  undefined1 local_28 [8];
  tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> t1;
  node_depth *this_local;
  
  t1._16_8_ = this;
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  local_2c = 2;
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::insert
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28,
             &local_2c);
  std::__cxx11::stringstream::stringstream(local_1c8);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_220,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_220);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_220);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_278,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_278);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_278);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_2d0,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_2d0);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_2d0);
    if (bVar2) {
      std::operator<<(local_1b8," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar8 = st_tree::detail::
             b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
             ::operator->(pcVar3);
    pdVar9 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(pnVar8);
    std::ostream::operator<<(local_1b8,*pdVar9);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_328,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_328);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_348);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_338,0x136,&local_348);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_380,"2");
    boost::test_tools::assertion_result::assertion_result(&local_360,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_460,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_440,&local_460,(char (*) [7])0x4060fe);
    boost::unit_test::operator<<(&local_420,&local_440,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_400,&local_420,(char (*) [2])0x405dd2);
    boost::unit_test::operator<<(&local_3e0,&local_400,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_3c0,&local_3e0,&local_480);
    boost::unit_test::operator<<(&local_3a0,&local_3c0,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_490,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_360,&local_3a0,&local_490,0x136,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_3a0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_3c0);
    std::__cxx11::string::~string((string *)&local_480);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_3e0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_400);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_420);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_440);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_460);
    boost::test_tools::assertion_result::~assertion_result(&local_360);
    std::__cxx11::string::~string((string *)&local_380);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_1c8);
  std::__cxx11::stringstream::stringstream(local_618);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_670,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_670);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_670);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_6c8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_6c8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_6c8);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_720,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_720);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_720);
    if (bVar2) {
      std::operator<<(local_608," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar7 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar3)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar10 = st_tree::detail::
             node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
             ::depth(pnVar7);
    std::ostream::operator<<(local_608,sVar10);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_778,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_778);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_788,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_798);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_788,0x137,&local_798);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_7d0,"1");
    boost::test_tools::assertion_result::assertion_result(&local_7b0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_8b0,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_890,&local_8b0,(char (*) [8])0x4057cf);
    boost::unit_test::operator<<(&local_870,&local_890,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_850,&local_870,(char (*) [2])0x40ef5b);
    boost::unit_test::operator<<(&local_830,&local_850,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_810,&local_830,&local_8d0);
    boost::unit_test::operator<<(&local_7f0,&local_810,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8e0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_7b0,&local_7f0,&local_8e0,0x137,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_7f0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_810);
    std::__cxx11::string::~string((string *)&local_8d0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_830);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_850);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_870);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
    ::~lazy_ostream_impl(&local_890);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_8b0);
    boost::test_tools::assertion_result::~assertion_result(&local_7b0);
    std::__cxx11::string::~string((string *)&local_7d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_618);
  std::__cxx11::stringstream::stringstream(local_a68);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_ac0,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_ac0);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_ac0);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_b18,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_b18);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_b18);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_b70,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_b70);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_b70);
    if (bVar2) {
      std::operator<<(local_a58," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar7 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar3)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar10 = st_tree::detail::
             node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
             ::ply(pnVar7);
    std::ostream::operator<<(local_a58,sVar10);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_bc8,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_bc8);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bd8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_be8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_bd8,0x138,&local_be8);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_c20,"0");
    boost::test_tools::assertion_result::assertion_result(&local_c00,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d00,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_ce0,&local_d00,(char (*) [6])"ply()");
    boost::unit_test::operator<<(&local_cc0,&local_ce0,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_ca0,&local_cc0,(char (*) [2])0x40ef4e);
    boost::unit_test::operator<<(&local_c80,&local_ca0,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_c60,&local_c80,&local_d20);
    boost::unit_test::operator<<(&local_c40,&local_c60,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d30,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_c00,&local_c40,&local_d30,0x138,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_c40);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_c60);
    std::__cxx11::string::~string((string *)&local_d20);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_c80);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_ca0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_cc0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_ce0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_d00);
    boost::test_tools::assertion_result::~assertion_result(&local_c00);
    std::__cxx11::string::~string((string *)&local_c20);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_a68);
  pnVar5 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  local_d4c = 3;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_d48,pnVar5,&local_d4c);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_d48);
  pnVar5 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  local_d6c = 5;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_d68,pnVar5,&local_d6c);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_d68);
  std::__cxx11::stringstream::stringstream(local_ef8);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_f50,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_f50);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_f50);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_fa8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_fa8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_fa8);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_1000,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_1000);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1000);
    if (bVar2) {
      std::operator<<(local_ee8," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar8 = st_tree::detail::
             b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
             ::operator->(pcVar3);
    pdVar9 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(pnVar8);
    std::ostream::operator<<(local_ee8,*pdVar9);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_1058,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1058);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1068,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1078);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1068,0x13c,&local_1078);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_10b0,"2 3 5");
    boost::test_tools::assertion_result::assertion_result(&local_1090,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1190,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_1170,&local_1190,(char (*) [7])0x4060fe);
    boost::unit_test::operator<<(&local_1150,&local_1170,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_1130,&local_1150,(char (*) [6])0x405dd6);
    boost::unit_test::operator<<(&local_1110,&local_1130,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_10f0,&local_1110,&local_11b0);
    boost::unit_test::operator<<(&local_10d0,&local_10f0,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11c0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_1090,&local_10d0,&local_11c0,0x13c,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_10d0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_10f0);
    std::__cxx11::string::~string((string *)&local_11b0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1110);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_1130);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1150);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_1170);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_1190);
    boost::test_tools::assertion_result::~assertion_result(&local_1090);
    std::__cxx11::string::~string((string *)&local_10b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_ef8);
  std::__cxx11::stringstream::stringstream(local_1348);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_13a0,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_13a0);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_13a0);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_13f8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_13f8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_13f8);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_1450,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_1450);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1450);
    if (bVar2) {
      std::operator<<(local_1338," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar7 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar3)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar10 = st_tree::detail::
             node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
             ::depth(pnVar7);
    std::ostream::operator<<(local_1338,sVar10);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_14a8,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_14a8);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_14b8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_14c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_14b8,0x13d,&local_14c8);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_1500,"2 1 1");
    boost::test_tools::assertion_result::assertion_result(&local_14e0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_15e0,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_15c0,&local_15e0,(char (*) [8])0x4057cf);
    boost::unit_test::operator<<(&local_15a0,&local_15c0,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_1580,&local_15a0,(char (*) [6])0x405db6);
    boost::unit_test::operator<<(&local_1560,&local_1580,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_1540,&local_1560,&local_1600);
    boost::unit_test::operator<<(&local_1520,&local_1540,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1610,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_14e0,&local_1520,&local_1610,0x13d,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_1520);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_1540);
    std::__cxx11::string::~string((string *)&local_1600);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1560);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_1580);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_15a0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
    ::~lazy_ostream_impl(&local_15c0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_15e0);
    boost::test_tools::assertion_result::~assertion_result(&local_14e0);
    std::__cxx11::string::~string((string *)&local_1500);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_1348);
  std::__cxx11::stringstream::stringstream(local_1798);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_17f0,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_17f0);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_17f0);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_1848,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_1848);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1848);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_18a0,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_18a0);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_18a0);
    if (bVar2) {
      std::operator<<(local_1788," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar7 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar3)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar10 = st_tree::detail::
             node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
             ::ply(pnVar7);
    std::ostream::operator<<(local_1788,sVar10);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_18f8,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_18f8);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1908,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1918);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1908,0x13e,&local_1918);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_1950,"0 1 1");
    boost::test_tools::assertion_result::assertion_result(&local_1930,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1a30,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_1a10,&local_1a30,(char (*) [6])"ply()");
    boost::unit_test::operator<<(&local_19f0,&local_1a10,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_19d0,&local_19f0,(char (*) [6])"0 1 1");
    boost::unit_test::operator<<(&local_19b0,&local_19d0,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_1990,&local_19b0,&local_1a50);
    boost::unit_test::operator<<(&local_1970,&local_1990,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a60,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_1930,&local_1970,&local_1a60,0x13e,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_1970);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_1990);
    std::__cxx11::string::~string((string *)&local_1a50);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_19b0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_19d0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_19f0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_1a10);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_1a30);
    boost::test_tools::assertion_result::~assertion_result(&local_1930);
    std::__cxx11::string::~string((string *)&local_1950);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_1798);
  pnVar5 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar6 = st_tree::detail::
           node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
           ::operator[](pnVar5,0);
  local_1a7c = 7;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_1a78,pnVar6,&local_1a7c);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_1a78);
  pnVar5 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar6 = st_tree::detail::
           node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
           ::operator[](pnVar5,0);
  local_1a9c = 0xb;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_1a98,pnVar6,&local_1a9c);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_1a98);
  pnVar5 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar6 = st_tree::detail::
           node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
           ::operator[](pnVar5,1);
  local_1abc = 0xd;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_1ab8,pnVar6,&local_1abc);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_1ab8);
  pnVar5 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar6 = st_tree::detail::
           node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
           ::operator[](pnVar5,1);
  local_1adc = 0x11;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_1ad8,pnVar6,&local_1adc);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_1ad8);
  std::__cxx11::stringstream::stringstream(local_1c68);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_1cc0,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_1cc0);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_1cc0);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_1d18,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_1d18);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1d18);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_1d70,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_1d70);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1d70);
    if (bVar2) {
      std::operator<<(local_1c58," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar8 = st_tree::detail::
             b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
             ::operator->(pcVar3);
    pdVar9 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(pnVar8);
    std::ostream::operator<<(local_1c58,*pdVar9);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_1dc8,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_1dc8);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1dd8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1de8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1dd8,0x144,&local_1de8);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_1e20,"2 3 5 7 11 13 17");
    boost::test_tools::assertion_result::assertion_result(&local_1e00,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1f00,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_1ee0,&local_1f00,(char (*) [7])0x4060fe);
    boost::unit_test::operator<<(&local_1ec0,&local_1ee0,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_1ea0,&local_1ec0,(char (*) [17])"2 3 5 7 11 13 17");
    boost::unit_test::operator<<(&local_1e80,&local_1ea0,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_1e60,&local_1e80,&local_1f20);
    boost::unit_test::operator<<(&local_1e40,&local_1e60,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f30,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_1e00,&local_1e40,&local_1f30,0x144,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[17],_const_char_(&)[17]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_1e40);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[17],_const_char_(&)[17]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_1e60);
    std::__cxx11::string::~string((string *)&local_1f20);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[17],_const_char_(&)[17]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1e80);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[17],_const_char_(&)[17]>
    ::~lazy_ostream_impl(&local_1ea0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_1ec0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_1ee0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_1f00);
    boost::test_tools::assertion_result::~assertion_result(&local_1e00);
    std::__cxx11::string::~string((string *)&local_1e20);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_1c68);
  std::__cxx11::stringstream::stringstream(local_20b8);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_2110,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_2110);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_2110);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_2168,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_2168);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_2168);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_21c0,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_21c0);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_21c0);
    if (bVar2) {
      std::operator<<(local_20a8," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar7 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar3)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar10 = st_tree::detail::
             node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
             ::depth(pnVar7);
    std::ostream::operator<<(local_20a8,sVar10);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_2218,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_2218);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2228,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2238);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2228,0x145,&local_2238);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_2270,"3 2 2 1 1 1 1");
    boost::test_tools::assertion_result::assertion_result(&local_2250,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2350,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_2330,&local_2350,(char (*) [8])0x4057cf);
    boost::unit_test::operator<<(&local_2310,&local_2330,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_22f0,&local_2310,(char (*) [14])"3 2 2 1 1 1 1");
    boost::unit_test::operator<<(&local_22d0,&local_22f0,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_22b0,&local_22d0,&local_2370);
    boost::unit_test::operator<<(&local_2290,&local_22b0,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2380,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_2250,&local_2290,&local_2380,0x145,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_2290);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_22b0);
    std::__cxx11::string::~string((string *)&local_2370);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_22d0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>
    ::~lazy_ostream_impl(&local_22f0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_2310);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
    ::~lazy_ostream_impl(&local_2330);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_2350);
    boost::test_tools::assertion_result::~assertion_result(&local_2250);
    std::__cxx11::string::~string((string *)&local_2270);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_20b8);
  std::__cxx11::stringstream::stringstream(local_2508);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_2560,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_2560);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_2560);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_25b8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_25b8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_25b8);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_2610,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_2610);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_2610);
    if (bVar2) {
      std::operator<<(local_24f8," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar7 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar3)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar10 = st_tree::detail::
             node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
             ::ply(pnVar7);
    std::ostream::operator<<(local_24f8,sVar10);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_2668,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_2668);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2678,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2688);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2678,0x146,&local_2688);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_26c0,"0 1 1 2 2 2 2");
    boost::test_tools::assertion_result::assertion_result(&local_26a0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_27a0,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_2780,&local_27a0,(char (*) [6])"ply()");
    boost::unit_test::operator<<(&local_2760,&local_2780,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_2740,&local_2760,(char (*) [14])"0 1 1 2 2 2 2");
    boost::unit_test::operator<<(&local_2720,&local_2740,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_2700,&local_2720,&local_27c0);
    boost::unit_test::operator<<(&local_26e0,&local_2700,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_27d0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_26a0,&local_26e0,&local_27d0,0x146,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_26e0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_2700);
    std::__cxx11::string::~string((string *)&local_27c0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_2720);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[14],_const_char_(&)[14]>
    ::~lazy_ostream_impl(&local_2740);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_2760);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_2780);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_27a0);
    boost::test_tools::assertion_result::~assertion_result(&local_26a0);
    std::__cxx11::string::~string((string *)&local_26c0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_2508);
  pnVar5 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  local_27ec = 0x4d;
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::insert
            (&local_27e8,pnVar5,&local_27ec);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_27e8);
  std::__cxx11::stringstream::stringstream(local_2978);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_29d0,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_29d0);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_29d0);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_2a28,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_2a28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_2a28);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_2a80,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_2a80);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_2a80);
    if (bVar2) {
      std::operator<<(local_2968," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar8 = st_tree::detail::
             b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
             ::operator->(pcVar3);
    pdVar9 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(pnVar8);
    std::ostream::operator<<(local_2968,*pdVar9);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_2ad8,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_2ad8);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2ae8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2af8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2ae8,0x149,&local_2af8);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_2b30,"2 3 5 77 7 11 13 17");
    boost::test_tools::assertion_result::assertion_result(&local_2b10,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2c10,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_2bf0,&local_2c10,(char (*) [7])0x4060fe);
    boost::unit_test::operator<<(&local_2bd0,&local_2bf0,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_2bb0,&local_2bd0,(char (*) [20])"2 3 5 77 7 11 13 17");
    boost::unit_test::operator<<(&local_2b90,&local_2bb0,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_2b70,&local_2b90,&local_2c30);
    boost::unit_test::operator<<(&local_2b50,&local_2b70,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c40,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_2b10,&local_2b50,&local_2c40,0x149,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[20],_const_char_(&)[20]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_2b50);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[20],_const_char_(&)[20]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_2b70);
    std::__cxx11::string::~string((string *)&local_2c30);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[20],_const_char_(&)[20]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_2b90);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[20],_const_char_(&)[20]>
    ::~lazy_ostream_impl(&local_2bb0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_2bd0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_2bf0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_2c10);
    boost::test_tools::assertion_result::~assertion_result(&local_2b10);
    std::__cxx11::string::~string((string *)&local_2b30);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_2978);
  std::__cxx11::stringstream::stringstream(local_2dc8);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_2e20,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_2e20);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_2e20);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_2e78,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_2e78);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_2e78);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_2ed0,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_2ed0);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_2ed0);
    if (bVar2) {
      std::operator<<(local_2db8," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar7 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar3)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar10 = st_tree::detail::
             node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
             ::depth(pnVar7);
    std::ostream::operator<<(local_2db8,sVar10);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_2f28,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_2f28);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f38,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2f48);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2f38,0x14a,&local_2f48);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_2f80,"3 2 2 1 1 1 1 1");
    boost::test_tools::assertion_result::assertion_result(&local_2f60,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3060,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_3040,&local_3060,(char (*) [8])0x4057cf);
    boost::unit_test::operator<<(&local_3020,&local_3040,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_3000,&local_3020,(char (*) [16])"3 2 2 1 1 1 1 1");
    boost::unit_test::operator<<(&local_2fe0,&local_3000,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_2fc0,&local_2fe0,&local_3080);
    boost::unit_test::operator<<(&local_2fa0,&local_2fc0,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3090,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_2f60,&local_2fa0,&local_3090,0x14a,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_2fa0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_2fc0);
    std::__cxx11::string::~string((string *)&local_3080);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_2fe0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>
    ::~lazy_ostream_impl(&local_3000);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_3020);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
    ::~lazy_ostream_impl(&local_3040);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_3060);
    boost::test_tools::assertion_result::~assertion_result(&local_2f60);
    std::__cxx11::string::~string((string *)&local_2f80);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_2dc8);
  std::__cxx11::stringstream::stringstream(local_3218);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_3270,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_3270);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_3270);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_32c8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_32c8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_32c8);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_3320,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_3320);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_3320);
    if (bVar2) {
      std::operator<<(local_3208," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar7 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar3)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar10 = st_tree::detail::
             node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
             ::ply(pnVar7);
    std::ostream::operator<<(local_3208,sVar10);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_3378,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_3378);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3388,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3398);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3388,0x14b,&local_3398);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_33d0,"0 1 1 1 2 2 2 2");
    boost::test_tools::assertion_result::assertion_result(&local_33b0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_34b0,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_3490,&local_34b0,(char (*) [6])"ply()");
    boost::unit_test::operator<<(&local_3470,&local_3490,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_3450,&local_3470,(char (*) [16])"0 1 1 1 2 2 2 2");
    boost::unit_test::operator<<(&local_3430,&local_3450,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_3410,&local_3430,&local_34d0);
    boost::unit_test::operator<<(&local_33f0,&local_3410,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_34e0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_33b0,&local_33f0,&local_34e0,0x14b,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_33f0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_3410);
    std::__cxx11::string::~string((string *)&local_34d0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_3430);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>,_char[16],_const_char_(&)[16]>
    ::~lazy_ostream_impl(&local_3450);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_3470);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[6],_const_char_(&)[6]>
    ::~lazy_ostream_impl(&local_3490);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_34b0);
    boost::test_tools::assertion_result::~assertion_result(&local_33b0);
    std::__cxx11::string::~string((string *)&local_33d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_3218);
  pnVar5 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar7 = &st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                      ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                       local_28)->
            super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  ;
  st_tree::detail::
  node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  ::begin(&local_34f8,pnVar7);
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::erase
            (pnVar5,&local_34f8);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_34f8);
  std::__cxx11::stringstream::stringstream(local_3680);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_36d8,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_36d8);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_36d8);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_3730,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_3730);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_3730);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_3788,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_3788);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_3788);
    if (bVar2) {
      std::operator<<(local_3670," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar8 = st_tree::detail::
             b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
             ::operator->(pcVar3);
    pdVar9 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(pnVar8);
    std::ostream::operator<<(local_3670,*pdVar9);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_37e0,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_37e0);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_37f0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3800);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_37f0,0x14e,&local_3800);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_3838,"2 5 77 13 17");
    boost::test_tools::assertion_result::assertion_result(&local_3818,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3918,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_38f8,&local_3918,(char (*) [7])0x4060fe);
    boost::unit_test::operator<<(&local_38d8,&local_38f8,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_38b8,&local_38d8,(char (*) [13])"2 5 77 13 17");
    boost::unit_test::operator<<(&local_3898,&local_38b8,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_3878,&local_3898,&local_3938);
    boost::unit_test::operator<<(&local_3858,&local_3878,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3948,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_3818,&local_3858,&local_3948,0x14e,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_3858);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_3878);
    std::__cxx11::string::~string((string *)&local_3938);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_3898);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_38b8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_38d8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_38f8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_3918);
    boost::test_tools::assertion_result::~assertion_result(&local_3818);
    std::__cxx11::string::~string((string *)&local_3838);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_3680);
  std::__cxx11::stringstream::stringstream(local_3ad0);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_3b28,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_3b28);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_3b28);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_3b80,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_3b80);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_3b80);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_3bd8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_3bd8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_3bd8);
    if (bVar2) {
      std::operator<<(local_3ac0," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar7 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar3)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar10 = st_tree::detail::
             node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
             ::depth(pnVar7);
    std::ostream::operator<<(local_3ac0,sVar10);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_3c30,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_3c30);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c40,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3c50);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3c40,0x14f,&local_3c50);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_3c88,"3 2 1 1 1");
    boost::test_tools::assertion_result::assertion_result(&local_3c68,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3d68,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_3d48,&local_3d68,(char (*) [8])0x4057cf);
    boost::unit_test::operator<<(&local_3d28,&local_3d48,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_3d08,&local_3d28,(char (*) [10])"3 2 1 1 1");
    boost::unit_test::operator<<(&local_3ce8,&local_3d08,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_3cc8,&local_3ce8,&local_3d88);
    boost::unit_test::operator<<(&local_3ca8,&local_3cc8,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d98,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_3c68,&local_3ca8,&local_3d98,0x14f,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_3ca8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_3cc8);
    std::__cxx11::string::~string((string *)&local_3d88);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_3ce8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[10],_const_char_(&)[10]>
    ::~lazy_ostream_impl(&local_3d08);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_3d28);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
    ::~lazy_ostream_impl(&local_3d48);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_3d68);
    boost::test_tools::assertion_result::~assertion_result(&local_3c68);
    std::__cxx11::string::~string((string *)&local_3c88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_3ad0);
  pnVar5 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar7 = &st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                      ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                       local_28)->
            super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  ;
  st_tree::detail::
  node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  ::begin(&local_3db0,pnVar7);
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::erase
            (pnVar5,&local_3db0);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_3db0);
  std::__cxx11::stringstream::stringstream(local_3f38);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_3f90,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_3f90);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_3f90);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_3fe8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_3fe8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_3fe8);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_4040,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_4040);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_4040);
    if (bVar2) {
      std::operator<<(local_3f28," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar8 = st_tree::detail::
             b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
             ::operator->(pcVar3);
    pdVar9 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(pnVar8);
    std::ostream::operator<<(local_3f28,*pdVar9);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_4098,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_4098);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_40a8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_40b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_40a8,0x152,&local_40b8);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_40f0,"2 77");
    boost::test_tools::assertion_result::assertion_result(&local_40d0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_41d0,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_41b0,&local_41d0,(char (*) [7])0x4060fe);
    boost::unit_test::operator<<(&local_4190,&local_41b0,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_4170,&local_4190,(char (*) [5])"2 77");
    boost::unit_test::operator<<(&local_4150,&local_4170,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_4130,&local_4150,&local_41f0);
    boost::unit_test::operator<<(&local_4110,&local_4130,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4200,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_40d0,&local_4110,&local_4200,0x152,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[5],_const_char_(&)[5]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_4110);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[5],_const_char_(&)[5]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_4130);
    std::__cxx11::string::~string((string *)&local_41f0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[5],_const_char_(&)[5]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_4150);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[5],_const_char_(&)[5]>
    ::~lazy_ostream_impl(&local_4170);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_4190);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_41b0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_41d0);
    boost::test_tools::assertion_result::~assertion_result(&local_40d0);
    std::__cxx11::string::~string((string *)&local_40f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_3f38);
  std::__cxx11::stringstream::stringstream(local_4388);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_43e0,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_43e0);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_43e0);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_4438,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_4438);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_4438);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_4490,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_4490);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_4490);
    if (bVar2) {
      std::operator<<(local_4378," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar7 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar3)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar10 = st_tree::detail::
             node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
             ::depth(pnVar7);
    std::ostream::operator<<(local_4378,sVar10);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_44e8,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_44e8);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_44f8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4508);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_44f8,0x153,&local_4508);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_4540,"2 1");
    boost::test_tools::assertion_result::assertion_result(&local_4520,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_4620,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_4600,&local_4620,(char (*) [8])0x4057cf);
    boost::unit_test::operator<<(&local_45e0,&local_4600,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_45c0,&local_45e0,(char (*) [4])"2 1");
    boost::unit_test::operator<<(&local_45a0,&local_45c0,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_4580,&local_45a0,&local_4640);
    boost::unit_test::operator<<(&local_4560,&local_4580,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4650,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_4520,&local_4560,&local_4650,0x153,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[4],_const_char_(&)[4]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_4560);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[4],_const_char_(&)[4]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_4580);
    std::__cxx11::string::~string((string *)&local_4640);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[4],_const_char_(&)[4]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_45a0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[4],_const_char_(&)[4]>
    ::~lazy_ostream_impl(&local_45c0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_45e0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
    ::~lazy_ostream_impl(&local_4600);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_4620);
    boost::test_tools::assertion_result::~assertion_result(&local_4520);
    std::__cxx11::string::~string((string *)&local_4540);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_4388);
  pnVar5 = st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  pnVar7 = &st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::root
                      ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                       local_28)->
            super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  ;
  st_tree::detail::
  node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
  ::begin(&local_4668,pnVar7);
  st_tree::detail::
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>::erase
            (pnVar5,&local_4668);
  st_tree::detail::
  valmap_iterator_adaptor_random<__gnu_cxx::__normal_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_**,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>,_st_tree::detail::dref_vmap<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  ::~valmap_iterator_adaptor_random(&local_4668);
  std::__cxx11::stringstream::stringstream(local_47f0);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_4848,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_4848);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_4848);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_48a0,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_48a0);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_48a0);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_48f8,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_48f8);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_48f8);
    if (bVar2) {
      std::operator<<(local_47e0," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar8 = st_tree::detail::
             b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
             ::operator->(pcVar3);
    pdVar9 = st_tree::detail::
             node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
             ::data(pnVar8);
    std::ostream::operator<<(local_47e0,*pdVar9);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_4950,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_4950);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4960,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4970);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4960,0x156,&local_4970);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_49a8,"2");
    boost::test_tools::assertion_result::assertion_result(&local_4988,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_4a88,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_4a68,&local_4a88,(char (*) [7])0x4060fe);
    boost::unit_test::operator<<(&local_4a48,&local_4a68,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_4a28,&local_4a48,(char (*) [2])0x405dd2);
    boost::unit_test::operator<<(&local_4a08,&local_4a28,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_49e8,&local_4a08,&local_4aa8);
    boost::unit_test::operator<<(&local_49c8,&local_49e8,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4ab8,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_4988,&local_49c8,&local_4ab8,0x156,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_49c8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_49e8);
    std::__cxx11::string::~string((string *)&local_4aa8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_4a08);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_4a28);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_4a48);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[7],_const_char_(&)[7]>
    ::~lazy_ostream_impl(&local_4a68);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_4a88);
    boost::test_tools::assertion_result::~assertion_result(&local_4988);
    std::__cxx11::string::~string((string *)&local_49a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_47f0);
  std::__cxx11::stringstream::stringstream(local_4c40);
  bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
            (&local_4c98,
             (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                     ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28
                     );
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::operator=(pcVar3,&local_4c98);
  st_tree::detail::
  b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::~b1st_iterator(&local_4c98);
  while( true ) {
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_end<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_4cf0,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_4cf0);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_4cf0);
    if (!bVar2) break;
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    bf_begin<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
              (&local_4d48,
               (tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
    bVar2 = st_tree::detail::
            b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
            ::operator!=(pcVar3,&local_4d48);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_4d48);
    if (bVar2) {
      std::operator<<(local_4c30," ");
    }
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    pnVar7 = &st_tree::detail::
              b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator->(pcVar3)->
              super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
    ;
    sVar10 = st_tree::detail::
             node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
             ::depth(pnVar7);
    std::ostream::operator<<(local_4c30,sVar10);
    pcVar3 = bf_j<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>>
                       ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)
                        local_28);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::operator++(&local_4da0,pcVar3);
    st_tree::detail::
    b1st_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_const_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
    ::~b1st_iterator(&local_4da0);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4db0,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4dc0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4db0,0x157,&local_4dc0);
    std::__cxx11::stringstream::str();
    bVar2 = std::operator==(&local_4df8,"1");
    boost::test_tools::assertion_result::assertion_result(&local_4dd8,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_4ed8,plVar4,(char (*) [10])"Checking ");
    boost::unit_test::operator<<(&local_4eb8,&local_4ed8,(char (*) [8])0x4057cf);
    boost::unit_test::operator<<(&local_4e98,&local_4eb8,(char (*) [13])": Expected \"");
    boost::unit_test::operator<<(&local_4e78,&local_4e98,(char (*) [2])0x40ef5b);
    boost::unit_test::operator<<(&local_4e58,&local_4e78,(char (*) [13])"\" received \"");
    std::__cxx11::stringstream::str();
    boost::unit_test::operator<<(&local_4e38,&local_4e58,&local_4ef8);
    boost::unit_test::operator<<(&local_4e18,&local_4e38,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f08,
               "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp"
               ,0x5a);
    boost::test_tools::tt_detail::report_assertion(&local_4dd8,&local_4e18,&local_4f08,0x157,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_4e18);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_4e38);
    std::__cxx11::string::~string((string *)&local_4ef8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_4e58);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_4e78);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>,_char[13],_const_char_(&)[13]>
    ::~lazy_ostream_impl(&local_4e98);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>,_char[8],_const_char_(&)[8]>
    ::~lazy_ostream_impl(&local_4eb8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[10],_const_char_(&)[10]>::
    ~lazy_ostream_impl(&local_4ed8);
    boost::test_tools::assertion_result::~assertion_result(&local_4dd8);
    std::__cxx11::string::~string((string *)&local_4df8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::stringstream::~stringstream(local_4c40);
  st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>::~tree
            ((tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(node_depth) {
    tree<int> t1;

    t1.insert(2);
    CHECK_TREE(t1, data(), "2");
    CHECK_TREE(t1, depth(), "1");
    CHECK_TREE(t1, ply(), "0");

    t1.root().insert(3);
    t1.root().insert(5);
    CHECK_TREE(t1, data(), "2 3 5");
    CHECK_TREE(t1, depth(), "2 1 1");
    CHECK_TREE(t1, ply(), "0 1 1");

    t1.root()[0].insert(7);
    t1.root()[0].insert(11);
    t1.root()[1].insert(13);
    t1.root()[1].insert(17);
    CHECK_TREE(t1, data(), "2 3 5 7 11 13 17");
    CHECK_TREE(t1, depth(), "3 2 2 1 1 1 1");
    CHECK_TREE(t1, ply(), "0 1 1 2 2 2 2");

    t1.root().insert(77);
    CHECK_TREE(t1, data(), "2 3 5 77 7 11 13 17");
    CHECK_TREE(t1, depth(), "3 2 2 1 1 1 1 1");
    CHECK_TREE(t1, ply(), "0 1 1 1 2 2 2 2");

    t1.root().erase(t1.root().begin());
    CHECK_TREE(t1, data(), "2 5 77 13 17");
    CHECK_TREE(t1, depth(), "3 2 1 1 1");

    t1.root().erase(t1.root().begin());
    CHECK_TREE(t1, data(), "2 77");
    CHECK_TREE(t1, depth(), "2 1");

    t1.root().erase(t1.root().begin());
    CHECK_TREE(t1, data(), "2");
    CHECK_TREE(t1, depth(), "1");
}